

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>
::~Matrix(Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>
          *this)

{
  Column_container *this_00;
  function<bool_(unsigned_int,_unsigned_int)> *pfVar1;
  Column_settings *pCVar2;
  pointer puVar3;
  pool<boost::default_user_allocator_malloc_free> *this_01;
  _Manager_type p_Var4;
  Chain_vine_swap_option *pCVar5;
  
  pCVar2 = this->colSettings_;
  this_00 = &(this->matrix_).matrix_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>_>_>
  ::_M_erase_at_end(this_00,(this->matrix_).matrix_.
                            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  puVar3 = (this->matrix_).pivotToColumnIndex_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->matrix_).pivotToColumnIndex_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->matrix_).pivotToColumnIndex_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  (this->matrix_).nextIndex_ = 0;
  (this->matrix_).colSettings_ = pCVar2;
  this_01 = (pool<boost::default_user_allocator_malloc_free> *)this->colSettings_;
  if (this_01 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(this_01);
    operator_delete(this_01,0x38);
  }
  puVar3 = (this->matrix_).pivotToColumnIndex_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->matrix_).pivotToColumnIndex_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>_>_>
  ::~vector(this_00);
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>_>_>,_std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>_>_>_>_>,_false,_unsigned_int>
  ::~Matrix_row_access(&(this->matrix_).super_Matrix_row_access_option);
  p_Var4 = (this->matrix_).super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pfVar1 = &(this->matrix_).super_Chain_vine_swap_option.deathComp_;
    (*p_Var4)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  p_Var4 = (this->matrix_).super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pCVar5 = &(this->matrix_).super_Chain_vine_swap_option;
    (*p_Var4)((_Any_data *)pCVar5,(_Any_data *)pCVar5,__destroy_functor);
  }
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::~Matrix()
{
  matrix_.reset(colSettings_);
  delete colSettings_;
}